

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void record_samples(MB_MODE_INFO *mbmi,int *pts,int *pts_inref,int row_offset,int sign_r,
                   int col_offset,int sign_c)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = block_size_high[mbmi->bsize];
  iVar2 = (int)((uint)block_size_wide[mbmi->bsize] * sign_c) / 2;
  *pts = col_offset * 0x20 + iVar2 * 8 + -8;
  pts[1] = row_offset * 0x20 + ((int)((uint)bVar1 * sign_r) / 2) * 8 + -8;
  *pts_inref = (int)mbmi->mv[0].as_mv.col + col_offset * 0x20 + iVar2 * 8 + -8;
  pts_inref[1] = (int)mbmi->mv[0].as_mv.row + pts[1];
  return;
}

Assistant:

static inline void record_samples(const MB_MODE_INFO *mbmi, int *pts,
                                  int *pts_inref, int row_offset, int sign_r,
                                  int col_offset, int sign_c) {
  const int bw = block_size_wide[mbmi->bsize];
  const int bh = block_size_high[mbmi->bsize];
  const int x = col_offset * MI_SIZE + sign_c * bw / 2 - 1;
  const int y = row_offset * MI_SIZE + sign_r * bh / 2 - 1;

  pts[0] = GET_MV_SUBPEL(x);
  pts[1] = GET_MV_SUBPEL(y);
  pts_inref[0] = pts[0] + mbmi->mv[0].as_mv.col;
  pts_inref[1] = pts[1] + mbmi->mv[0].as_mv.row;
}